

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::
Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
::eraseImpl(Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
            *this,size_t pos)

{
  undefined8 uVar1;
  size_t oldPos;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = pos * 0x18;
  Impl<0UL,_false>::erase
            ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
             this,pos,(StringPtr *)(*(long *)this + lVar4));
  lVar2 = *(long *)(this + 8);
  oldPos = (lVar2 - *(long *)this) / 0x18 - 1;
  if (oldPos != pos) {
    lVar3 = oldPos * 0x18;
    Impl<0UL,_false>::move
              ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
               this,oldPos,pos,(StringPtr *)(*(long *)this + lVar3));
    lVar2 = *(long *)this;
    *(undefined8 *)(lVar2 + 0x10 + lVar4) = *(undefined8 *)(lVar2 + 0x10 + lVar3);
    uVar1 = ((undefined8 *)(lVar2 + lVar3))[1];
    *(undefined8 *)(lVar2 + lVar4) = *(undefined8 *)(lVar2 + lVar3);
    ((undefined8 *)(lVar2 + lVar4))[1] = uVar1;
    lVar2 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar2 + -0x18;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}